

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O1

void mk_server_loop_balancer(mk_server *server)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mk_list *list;
  mk_event_loop *loop;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  mk_sched_worker *sched;
  mk_sched_conn *data;
  mk_list *__mptr;
  mk_list *pmVar10;
  mk_server_listen *unaff_RBP;
  long lVar11;
  long lVar12;
  uint64_t val;
  mk_event management_event;
  long local_88 [11];
  
  list = mk_server_listen_init(server);
  if (list == (mk_list *)0x0) {
    mk_print(0x1001,"Failed to initialize listen sockets.");
    return;
  }
  loop = mk_event_loop_create(0x100);
  if (loop == (mk_event_loop *)0x0) {
    mk_print(0x1001,"Could not initialize event loop");
    exit(1);
  }
  for (pmVar10 = list->next; pmVar10 != list; pmVar10 = pmVar10->next) {
    mk_event_add(loop,*(int *)&pmVar10[-2].prev,1,1,&pmVar10[-7].next);
  }
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[10] = 0;
  bVar3 = true;
  mk_event_add(loop,server->lib_ch_manager[0],0,1,local_88 + 2);
  do {
    if (!bVar3) {
      mk_event_loop_destroy(loop);
      mk_server_listen_exit(list);
      return;
    }
    mk_event_wait(loop);
    pvVar2 = loop->data;
    if (0 < loop->n_events) {
      unaff_RBP = *(mk_server_listen **)(*(long *)((long)pvVar2 + 8) + 4);
    }
    bVar3 = true;
    bVar4 = true;
    if (0 < loop->n_events) {
      lVar12 = 0x10;
      lVar11 = 0;
      do {
        uVar1 = (unaff_RBP->event).mask;
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 0x2018) != 0) {
            uVar1 = (unaff_RBP->event).fd;
            piVar7 = __errno_location();
            pcVar8 = strerror(*piVar7);
            mk_print(0x1001,"[server] Error on socket %d: %s",(ulong)uVar1,pcVar8);
          }
        }
        else {
          iVar5 = (unaff_RBP->event).fd;
          if (server->lib_ch_manager[0] == iVar5) {
            sVar9 = read(iVar5,local_88,8);
            if (sVar9 == 0) {
              bVar4 = false;
              bVar3 = true;
              goto LAB_0010f967;
            }
            if (local_88[0] == 0xdddddddd) {
              bVar3 = false;
              goto LAB_0010f965;
            }
          }
          else {
            sched = mk_sched_next_target(server);
            if (sched == (mk_sched_worker *)0x0) {
              mk_print(0x1002,"[server] Over capacity.");
            }
            else {
              iVar5 = mk_socket_accept(unaff_RBP->server_fd);
              if (iVar5 != -1) {
                data = mk_sched_add_connection(iVar5,unaff_RBP,sched,server);
                if (data != (mk_sched_conn *)0x0) {
                  iVar6 = mk_event_add(sched->loop,iVar5,3,1,data);
                  if (iVar6 == 0) {
                    sched->accepted_connections = sched->accepted_connections + 1;
                    goto LAB_0010f8d8;
                  }
                  mk_server_loop_balancer_cold_1();
                }
                (*unaff_RBP->network->network->close)(unaff_RBP->network,iVar5);
              }
LAB_0010f8d8:
              if (0 < sched->signal_channel_w) {
                local_88[1] = 0xeeffaacc;
                write(sched->signal_channel_w,local_88 + 1,8);
              }
            }
          }
        }
        lVar11 = lVar11 + 1;
        if (lVar11 < loop->n_events) {
          unaff_RBP = *(mk_server_listen **)(*(long *)((long)pvVar2 + 8) + lVar12);
        }
        else {
          unaff_RBP = (mk_server_listen *)0x0;
        }
        lVar12 = lVar12 + 0xc;
      } while (lVar11 < loop->n_events);
      bVar3 = true;
LAB_0010f965:
      bVar4 = true;
    }
LAB_0010f967:
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void mk_server_loop_balancer(struct mk_server *server)
{
    size_t bytes;
    uint64_t val;
    int operation_flag;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_server_listen *listener;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_sched_worker *sched;
    struct mk_event management_event;

    /* Init the listeners */
    listeners = mk_server_listen_init(server);
    if (!listeners) {
        mk_err("Failed to initialize listen sockets.");
        return;
    }

    /* Create an event loop context */
    evl = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!evl) {
        mk_err("Could not initialize event loop");
        exit(EXIT_FAILURE);
    }

    /* Register the listeners */
    mk_list_foreach(head, listeners) {
        listener = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_add(evl, listener->server_fd,
                     MK_EVENT_LISTENER, MK_EVENT_READ,
                     listener);
    }

    memset(&management_event, 0, sizeof(struct mk_event));

    mk_event_add(evl,
                 server->lib_ch_manager[0],
                 MK_EVENT_NOTIFICATION,
                 MK_EVENT_READ,
                 &management_event);

    operation_flag = MK_TRUE;
    while (operation_flag) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            if (event->mask & MK_EVENT_READ) {
                /* This signal is sent by mk_stop and both this and
                 * mk_lib_worker are expecting it.
                 */
                if (server->lib_ch_manager[0] == event->fd) {
#ifdef _WIN32
        bytes = recv(event->fd, &val, sizeof(uint64_t), MSG_WAITALL);
#else
        bytes = read(event->fd, &val, sizeof(uint64_t));
#endif

                    if (bytes <= 0) {
                        return;
                    }

                    if (val == MK_SERVER_SIGNAL_STOP) {
                        operation_flag = MK_FALSE;

                        break;
                    }

                    continue;
                }

                /*
                 * Accept connection: determinate which thread may work on this
                 * new connection.
                 */
                sched = mk_sched_next_target(server);
                if (sched != NULL) {
                    mk_server_listen_handler(sched, event, server);

                    mk_server_lib_notify_event_loop_break(sched);

#ifdef MK_HAVE_TRACE
                    int i;
                    struct mk_sched_ctx *ctx = server->sched_ctx;

                    for (i = 0; i < server->workers; i++) {
                        MK_TRACE("Worker Status");
                        MK_TRACE(" WID %i / conx = %llu",
                                 ctx->workers[i].idx,
                                 ctx->workers[i].accepted_connections -
                                 ctx->workers[i].closed_connections);
                    }
#endif
                }
                else {
                    mk_warn("[server] Over capacity.");
                }
            }
            else if (event->mask & MK_EVENT_CLOSE) {
                mk_err("[server] Error on socket %d: %s",
                       event->fd, strerror(errno));
            }
        }
    }
    mk_event_loop_destroy(evl);
    mk_server_listen_exit(listeners);
}